

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O0

Var Js::JavascriptConversion::OrdinaryToPrimitive<(Js::JavascriptHint)0>
              (RecyclableObject *value,ScriptContext *requestContext)

{
  int iVar1;
  ScriptContext *checkScriptContext;
  JavascriptLibrary *this;
  int32 hCode;
  ScriptContext *scriptContext;
  Var result;
  ScriptContext *requestContext_local;
  RecyclableObject *value_local;
  
  result = requestContext;
  requestContext_local = (ScriptContext *)value;
  iVar1 = (*(value->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x2c])(value,0,&scriptContext,requestContext);
  if (iVar1 == 0) {
    checkScriptContext =
         RecyclableObject::GetScriptContext((RecyclableObject *)requestContext_local);
    JavascriptError::TryThrowTypeError
              (checkScriptContext,checkScriptContext,-0x7ff5fe4a,(PCWSTR)0x0);
    this = ScriptContext::GetLibrary((ScriptContext *)result);
    value_local = JavascriptLibraryBase::GetNull(&this->super_JavascriptLibraryBase);
  }
  else {
    value_local = (RecyclableObject *)scriptContext;
  }
  return value_local;
}

Assistant:

Var JavascriptConversion::OrdinaryToPrimitive(_In_ RecyclableObject* value, _In_ ScriptContext* requestContext)
    {
        Var result;
        if (!value->ToPrimitive(hint, &result, requestContext))
        {
            ScriptContext *const scriptContext = value->GetScriptContext();

            int32 hCode;

            switch (hint)
            {
            case JavascriptHint::HintNumber:
                hCode = JSERR_NeedNumber;
                break;
            case JavascriptHint::HintString:
                hCode = JSERR_NeedString;
                break;
            default:
                hCode = VBSERR_OLENoPropOrMethod;
                break;
            }
            JavascriptError::TryThrowTypeError(scriptContext, scriptContext, hCode);
            return requestContext->GetLibrary()->GetNull();
        }
        return result;
    }